

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLExtensionHandler.h
# Opt level: O2

void __thiscall
irr::video::COpenGLExtensionHandler::irrGlGenFramebuffers
          (COpenGLExtensionHandler *this,GLsizei n,GLuint *framebuffers)

{
  PFNGLGENFRAMEBUFFERSPROC UNRECOVERED_JUMPTABLE;
  
  if (framebuffers != (GLuint *)0x0) {
    memset(framebuffers,0,(long)n << 2);
  }
  UNRECOVERED_JUMPTABLE = this->pGlGenFramebuffers;
  if ((UNRECOVERED_JUMPTABLE == (PFNGLGENFRAMEBUFFERSPROC)0x0) &&
     (UNRECOVERED_JUMPTABLE = this->pGlGenFramebuffersEXT,
     UNRECOVERED_JUMPTABLE == (PFNGLGENFRAMEBUFFERSPROC)0x0)) {
    return;
  }
  (*UNRECOVERED_JUMPTABLE)(n,framebuffers);
  return;
}

Assistant:

inline void COpenGLExtensionHandler::irrGlGenFramebuffers(GLsizei n, GLuint *framebuffers)
{
	if (framebuffers)
		memset(framebuffers, 0, n * sizeof(GLuint));
	if (pGlGenFramebuffers)
		pGlGenFramebuffers(n, framebuffers);
	else if (pGlGenFramebuffersEXT)
		pGlGenFramebuffersEXT(n, framebuffers);
}